

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O3

result __thiscall
dtc::anon_unknown_1::ternary_conditional_operator::operator()(ternary_conditional_operator *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint extraout_EDX;
  uint extraout_EDX_00;
  ulong extraout_RDX;
  ulong uVar4;
  unsigned_long_long uVar5;
  bool bVar6;
  result rVar7;
  
  iVar1 = (**((this->cond)._M_t.
              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)
             ->_vptr_expression)();
  iVar2 = (**((this->lhs)._M_t.
              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)
             ->_vptr_expression)();
  iVar3 = (**((this->rhs)._M_t.
              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)
             ->_vptr_expression)();
  if ((((extraout_EDX_00 & 1) == 0) || ((extraout_RDX & 1) == 0)) || ((extraout_EDX & 1) == 0)) {
    uVar5 = 0;
    uVar4 = 0;
  }
  else {
    bVar6 = CONCAT44(extraout_var,iVar1) == 0;
    uVar5 = CONCAT44(extraout_var_00,iVar2);
    if (bVar6) {
      uVar5 = CONCAT44(extraout_var_01,iVar3);
    }
    uVar4 = (ulong)(extraout_EDX_00 & 0xff);
    if (bVar6) {
      uVar4 = extraout_RDX & 0xff;
    }
  }
  rVar7._8_8_ = uVar4;
  rVar7.first = uVar5;
  return rVar7;
}

Assistant:

result operator()() override
	{
		result c = (*cond)();
		result l = (*lhs)();
		result r = (*rhs)();
		if (!(l.second && r.second && c.second))
		{
			return {0, false};
		}
		return c.first ? l : r;
	}